

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O3

void aalcalcmeanonly::ReadInputStream(FILE *fin)

{
  size_t sVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  int iVar4;
  bool bVar5;
  sampleslevelRec sr;
  summarySampleslevelHeader sh;
  int local_54;
  float local_50;
  key_type local_4c;
  key_type local_48 [2];
  mapped_type local_40;
  double local_38;
  
  sVar1 = fread(&local_4c,0xc,1,(FILE *)fin);
  if (sVar1 != 0) {
    do {
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)eventToWeighting_,&local_4c);
      local_40 = *pmVar2;
      do {
        sVar1 = fread(&local_54,8,1,(FILE *)fin);
        if (1 < local_54 + 5U) {
          if ((sVar1 == 0) || (local_54 == 0)) break;
          bVar5 = local_54 != -1;
          iVar4 = 1;
          if (bVar5) {
            iVar4 = sampleSize_;
          }
          local_38 = ((double)local_50 * local_40) / (double)iVar4;
          pmVar3 = std::
                   map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                   ::operator[]((map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                                 *)means_,local_48);
          pmVar3->_M_elems[bVar5] = local_38 + pmVar3->_M_elems[bVar5];
        }
      } while (sVar1 != 0);
      sVar1 = fread(&local_4c,0xc,1,(FILE *)fin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

inline void ReadInputStream(FILE *fin) {

    summarySampleslevelHeader sh;
    size_t i = fread(&sh, sizeof(sh), 1, fin);
    while (i != 0) {

      double weight = eventToWeighting_[sh.event_id];

      while (i != 0) {

        sampleslevelRec sr;
        i = fread(&sr, sizeof(sr), 1, fin);

        if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
        if (i == 0 || sr.sidx == 0) break;

        means_[sh.summary_id][sr.sidx != -1] += (sr.loss * weight / (1 + (sampleSize_ - 1) * (sr.sidx != -1)));

      }

      i = fread(&sh, sizeof(sh), 1, fin);

    }

  }